

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O2

void __thiscall
tcu::ResultCollector::setTestContextResult(ResultCollector *this,TestContext *testCtx)

{
  qpTestResult testResult;
  char *local_38 [4];
  
  testResult = QP_TEST_RESULT_PASS;
  if (this->m_result != QP_TEST_RESULT_LAST) {
    testResult = this->m_result;
  }
  std::__cxx11::string::string((string *)local_38,(string *)&this->m_message);
  TestContext::setTestResult(testCtx,testResult,local_38[0]);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ResultCollector::setTestContextResult (TestContext& testCtx)
{
	testCtx.setTestResult(getResult(), getMessage().c_str());
}